

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_tests.cpp
# Opt level: O2

void density_tests::lifo_tests
               (QueueTesterFlags i_flags,ostream *i_output,uint32_t i_random_seed,size_t i_depth,
               size_t i_fork_depth)

{
  pointer pTVar1;
  uint64_t uVar2;
  pointer __result;
  ulong uVar3;
  ulong uVar4;
  pointer __result_00;
  pointer pTVar5;
  _Tp_alloc_type *p_Var6;
  char *i_label;
  long lVar7;
  pointer pTVar8;
  ulong uVar9;
  bool bVar10;
  vector<ThreadEntry,_std::allocator<ThreadEntry>_> threads;
  long *local_1428;
  ScopedLeakCheck scoped_leak_check;
  thread local_13f8;
  PrintScopeDuration duration;
  EasyRandom main_random;
  
  i_label = "lifo_tests with exceptions";
  if ((i_flags & eTestExceptions) == eNone) {
    i_label = "lifo_tests";
  }
  p_Var6 = (_Tp_alloc_type *)i_depth;
  PrintScopeDuration::PrintScopeDuration(&duration,i_output,i_label);
  InstanceCounted::ScopedLeakCheck::ScopedLeakCheck(&scoped_leak_check);
  if (i_random_seed == 0) {
    EasyRandom::EasyRandom(&main_random);
  }
  else {
    EasyRandom::EasyRandom(&main_random,i_random_seed);
  }
  uVar2 = get_num_of_processors();
  threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __result = (pointer)operator_new(0x7590);
  std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::_S_relocate
            ((pointer)0x0,(pointer)0x0,__result,p_Var6);
  threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __result + 6;
  lVar7 = 6;
  threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_start = __result;
  threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = __result;
  while( true ) {
    while( true ) {
      pTVar1 = threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar10 = lVar7 == 0;
      lVar7 = lVar7 + -1;
      if (bVar10) {
        for (lVar7 = 0;
            pTVar1 = threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
                     super__Vector_impl_data._M_finish,
            pTVar8 = threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
                     super__Vector_impl_data._M_start, lVar7 != 6; lVar7 = lVar7 + 1) {
          local_13f8._M_id._M_thread = (id)0;
          local_1428 = (long *)operator_new(0x40);
          *local_1428 = (long)&PTR___State_0147eac0;
          local_1428[1] = (long)__result;
          local_1428[2] = (long)i_output;
          local_1428[3] = lVar7;
          local_1428[4] =
               (ulong)-(uint)((i_flags & eReserveCoreToMainThread) == eNone || uVar2 < 4) |
               0xfffffffffffffffd;
          *(QueueTesterFlags *)(local_1428 + 5) = i_flags;
          local_1428[6] = i_depth;
          local_1428[7] = i_fork_depth;
          std::thread::_M_start_thread(&local_13f8,&local_1428,0);
          if (local_1428 != (long *)0x0) {
            (**(code **)(*local_1428 + 8))();
          }
          std::thread::operator=(&__result->m_thread,&local_13f8);
          std::thread::~thread(&local_13f8);
          __result = __result + 1;
        }
        for (; pTVar8 != pTVar1; pTVar8 = pTVar8 + 1) {
          std::thread::join();
        }
        std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::~vector(&threads);
        InstanceCounted::ScopedLeakCheck::~ScopedLeakCheck(&scoped_leak_check);
        PrintScopeDuration::~PrintScopeDuration(&duration);
        return;
      }
      if (threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) break;
      EasyRandom::fork(&(threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->m_random);
      (pTVar1->m_thread)._M_id._M_thread = 0;
      threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1 + 1;
    }
    if ((long)threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__result == 0x7ffffffffffff188) break;
    uVar3 = ((long)threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)__result) / 0x1398;
    uVar4 = uVar3;
    if (threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
        super__Vector_impl_data._M_finish == __result) {
      uVar4 = 1;
    }
    uVar9 = uVar4 + uVar3;
    p_Var6 = (_Tp_alloc_type *)0x6885eb95d7fcb;
    if (0x6885eb95d7fca < uVar9) {
      uVar9 = 0x6885eb95d7fcb;
    }
    if (CARRY8(uVar4,uVar3)) {
      uVar9 = 0x6885eb95d7fcb;
    }
    if (uVar9 == 0) {
      __result_00 = (pointer)0x0;
    }
    else {
      __result_00 = (pointer)operator_new(uVar9 * 0x1398);
    }
    EasyRandom::fork(&__result_00[uVar3].m_random);
    __result_00[uVar3].m_thread._M_id._M_thread = 0;
    pTVar5 = std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::_S_relocate
                       (__result,pTVar1,__result_00,p_Var6);
    pTVar5 = std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::_S_relocate
                       (pTVar1,pTVar1,pTVar5 + 1,p_Var6);
    if (__result != (pointer)0x0) {
      operator_delete(__result);
    }
    threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __result_00 + uVar9;
    __result = __result_00;
    threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
    super__Vector_impl_data._M_start = __result_00;
    threads.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar5;
  }
  std::__throw_length_error("vector::_M_realloc_insert");
}

Assistant:

void lifo_tests(
      QueueTesterFlags i_flags,
      std::ostream &   i_output,
      uint32_t         i_random_seed,
      size_t           i_depth,
      size_t           i_fork_depth)
    {
        PrintScopeDuration duration(
          i_output,
          i_flags && QueueTesterFlags::eTestExceptions ? "lifo_tests with exceptions"
                                                       : "lifo_tests");

        /* this checks that TestObject's don't leak. Note: the instance counting is not thread local, so we have to scope the thread
            procedures inside it. */
        InstanceCounted::ScopedLeakCheck scoped_leak_check;

        EasyRandom main_random = i_random_seed == 0 ? EasyRandom() : EasyRandom(i_random_seed);

        auto const num_of_processors = get_num_of_processors();
        bool const reserve_core1_to_main =
          (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;
        uint64_t affinity_mask = std::numeric_limits<uint64_t>::max();
        if (reserve_core1_to_main)
            affinity_mask -= 2;

        // create thread entries - here we pay the cost of forking the random generator
        const size_t thread_count = 6;
        struct ThreadEntry
        {
            EasyRandom  m_random;
            std::thread m_thread;
            ThreadEntry(EasyRandom & i_main_random) : m_random(i_main_random.fork()) {}
        };
        std::vector<ThreadEntry> threads;
        threads.reserve(thread_count);
        for (size_t thread_index = 0; thread_index < thread_count; thread_index++)
        {
            threads.emplace_back(main_random);
        }

#ifdef DENSITY_USER_DATA_STACK
        density::user_data_stack::stats_header(i_output);
#endif

        // start threads
        for (size_t thread_index = 0; thread_index < thread_count; thread_index++)
        {
            auto & thread_entry   = threads[thread_index];
            auto & thread_random  = thread_entry.m_random;
            thread_entry.m_thread = std::thread([&thread_random,
                                                 &i_output,
                                                 thread_index,
                                                 affinity_mask,
                                                 i_flags,
                                                 i_depth,
                                                 i_fork_depth] {
                set_thread_affinity(affinity_mask);

                lifo_test_thread_proc(i_flags, thread_random, i_depth, i_fork_depth);

                std::ostringstream thread_name_stream;
                thread_name_stream << "thread " << thread_index;
                std::string thread_name = thread_name_stream.str();

                std::ostringstream stats_stream;
#ifdef DENSITY_USER_DATA_STACK
                density::user_data_stack::stats_print(stats_stream, thread_name.c_str());
#else
                stats_stream << thread_name << " has finished\n";
#endif
                i_output << stats_stream.str();
                i_output.flush();
            });
        }

        // join threads
        for (auto & thread_entry : threads)
        {
            thread_entry.m_thread.join();
        }
    }